

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O1

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:581:61)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  size_t sVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  pthread_mutex_t *__mutex;
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  vector<int,_std::allocator<int>_> *pvVar4;
  code *pcVar5;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  bool bVar6;
  char extraout_AL_05;
  int iVar7;
  variant_alternative_t<0UL,_variant<int,_monostate>_> *pvVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar9;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  ResultBuilder DOCTEST_RB;
  Result local_e0;
  int local_bc;
  ResultBuilder local_b8;
  Expression_lhs<const_unsigned_long_&> local_40;
  size_t local_30;
  
  sVar1 = pf->_pipe;
  if (sVar1 == 2) {
    pvVar8 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_bc = *pvVar8;
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x246;
    local_b8.super_AssertData.m_expr = "j3++ < N";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    paVar3 = *(atomic<unsigned_long> **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>,_false>
                      ._M_head_impl._callable + 8);
    LOCK();
    local_40.lhs = (unsigned_long *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
              (&local_e0,(Expression_lhs<const_unsigned_long> *)&local_40,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                .
                super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                .
                super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar9 = extraout_XMM0_Qa_05;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar9 = extraout_XMM0_Qa_06;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar9);
    if (extraout_AL_02 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b8.super_AssertData.m_failed == true) &&
       (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
      doctest::detail::throwException();
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    __mutex = *(pthread_mutex_t **)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>,_false>
                       ._M_head_impl._callable + 0x10);
    iVar7 = pthread_mutex_lock(__mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x249;
    local_b8.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>,_false>
                            ._M_head_impl._callable + 0x20));
    local_40.m_at = DT_REQUIRE;
    local_30 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar9 = extraout_XMM0_Qa_07;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar9 = extraout_XMM0_Qa_08;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar9);
    if (extraout_AL_03 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b8.super_AssertData.m_failed == true) &&
       (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
      doctest::detail::throwException();
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    this_00 = *(vector<int,std::allocator<int>> **)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>,_false>
                       ._M_head_impl._callable + 0x18);
    __position._M_current = *(int **)(this_00 + 8);
    if (__position._M_current == *(int **)(this_00 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (this_00,__position,&local_bc);
    }
    else {
      *__position._M_current = local_bc;
      *(int **)(this_00 + 8) = __position._M_current + 1;
    }
    pthread_mutex_unlock(__mutex);
  }
  else {
    if (sVar1 == 1) {
      pvVar8 = std::get<0ul,int,std::monostate>
                         (&(this->_buffer).
                           super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
      local_bc = *pvVar8;
      local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_b8.super_AssertData.m_at = DT_REQUIRE;
      local_b8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_b8.super_AssertData.m_line = 0x23c;
      local_b8.super_AssertData.m_expr = "j2 < N";
      local_b8.super_AssertData.m_failed = true;
      local_b8.super_AssertData.m_threw = false;
      local_b8.super_AssertData.m_threw_as = false;
      local_b8.super_AssertData.m_exception_type = "";
      local_b8.super_AssertData.m_exception_string = "";
      local_40.lhs = (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                     .
                     super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                     .
                     super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_false>
                     ._M_head_impl._callable.j2;
      local_40.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
                (&local_e0,&local_40,
                 &(this->_pipes).
                  super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                  .
                  super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                  .
                  super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_false>
                  ._M_head_impl._callable.N);
      doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_b8.super_AssertData._40_2_ =
           CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar9 = extraout_XMM0_Qa;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar9 = extraout_XMM0_Qa_00;
      }
      doctest::detail::ResultBuilder::log(&local_b8,dVar9);
      if (extraout_AL != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if ((local_b8.super_AssertData.m_failed == true) &&
         (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
        doctest::detail::throwException();
      }
      if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                           local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_b8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                           local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                           local_b8.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_b8.super_AssertData.m_at = DT_REQUIRE;
      local_b8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_b8.super_AssertData.m_line = 0x23d;
      local_b8.super_AssertData.m_expr = "source[j2] + 1 == input";
      local_b8.super_AssertData.m_failed = true;
      local_b8.super_AssertData.m_threw = false;
      local_b8.super_AssertData.m_threw_as = false;
      local_b8.super_AssertData.m_exception_type = "";
      local_b8.super_AssertData.m_exception_string = "";
      local_40.lhs = (unsigned_long *)
                     ((ulong)((((this->_pipes).
                                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                                .
                                super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                                .
                                super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_false>
                                ._M_head_impl._callable.source)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start
                              [*(this->_pipes).
                                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                                .
                                super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                                .
                                super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_false>
                                ._M_head_impl._callable.j2] + 1) | 0xc00000000);
      doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
                (&local_e0,(Expression_lhs<const_int> *)&local_40,&local_bc);
      doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_b8.super_AssertData._40_2_ =
           CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar9 = extraout_XMM0_Qa_01;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar9 = extraout_XMM0_Qa_02;
      }
      doctest::detail::ResultBuilder::log(&local_b8,dVar9);
      if (extraout_AL_00 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if ((local_b8.super_AssertData.m_failed == true) &&
         (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
        doctest::detail::throwException();
      }
      if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                           local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_b8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                           local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                           local_b8.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_b8.super_AssertData.m_at = DT_REQUIRE;
      local_b8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_b8.super_AssertData.m_line = 0x23e;
      local_b8.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      local_b8.super_AssertData.m_failed = true;
      local_b8.super_AssertData.m_threw = false;
      local_b8.super_AssertData.m_threw_as = false;
      local_b8.super_AssertData.m_exception_type = "";
      local_b8.super_AssertData.m_exception_string = "";
      local_40.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                     .
                     super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                     .
                     super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_false>
                     ._M_head_impl._callable.L);
      local_40.m_at = DT_REQUIRE;
      local_30 = pf->_line;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
      doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_b8.super_AssertData._40_2_ =
           CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar9 = extraout_XMM0_Qa_03;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar9 = extraout_XMM0_Qa_04;
      }
      doctest::detail::ResultBuilder::log(&local_b8,dVar9);
      if (extraout_AL_01 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if ((local_b8.super_AssertData.m_failed == true) &&
         (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
        doctest::detail::throwException();
      }
      if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                           local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_b8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                           local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                           local_b8.super_AssertData.m_exception.field_0.buf[0]));
      }
      psVar2 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_false>
               ._M_head_impl._callable.j2;
      *psVar2 = *psVar2 + 1;
      iVar7 = local_bc;
    }
    else {
      if (sVar1 != 0) {
        return;
      }
      psVar2 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_false>
               ._M_head_impl._callable.j1;
      if (*psVar2 ==
          (this->_pipes).
          super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
          .
          super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_false>
          ._M_head_impl._callable.N) {
        pf->_stop = true;
        iVar7 = 0;
      }
      else {
        local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_b8.super_AssertData.m_at = DT_REQUIRE;
        local_b8.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
        ;
        local_b8.super_AssertData.m_line = 0x233;
        local_b8.super_AssertData.m_expr = "j1 == source[j1]";
        local_b8.super_AssertData.m_failed = true;
        local_b8.super_AssertData.m_threw = false;
        local_b8.super_AssertData.m_threw_as = false;
        local_b8.super_AssertData.m_exception_type = "";
        local_b8.super_AssertData.m_exception_string = "";
        local_40.m_at = DT_REQUIRE;
        local_40.lhs = psVar2;
        doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                  (&local_e0,&local_40,
                   (((this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_false>
                     ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>)
                   ._M_impl.super__Vector_impl_data._M_start + *psVar2);
        doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
        local_b8.super_AssertData._40_2_ =
             CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
        dVar9 = extraout_XMM0_Qa_09;
        if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_e0.m_decomp.field_0.data.ptr);
          dVar9 = extraout_XMM0_Qa_10;
        }
        doctest::detail::ResultBuilder::log(&local_b8,dVar9);
        if (extraout_AL_04 != '\0') {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
        if ((local_b8.super_AssertData.m_failed == true) &&
           (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
          doctest::detail::throwException();
        }
        if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                             local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                             local_b8.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                             local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                             local_b8.super_AssertData.m_exception.field_0.buf[0]));
        }
        local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_b8.super_AssertData.m_at = DT_REQUIRE;
        local_b8.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
        ;
        local_b8.super_AssertData.m_line = 0x234;
        local_b8.super_AssertData.m_expr = "pf.token() % L == pf.line()";
        local_b8.super_AssertData.m_failed = true;
        local_b8.super_AssertData.m_threw = false;
        local_b8.super_AssertData.m_threw_as = false;
        local_b8.super_AssertData.m_exception_type = "";
        local_b8.super_AssertData.m_exception_string = "";
        local_40.lhs = (unsigned_long *)
                       (pf->_token %
                       (this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                       .
                       super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_false>
                       ._M_head_impl._callable.L);
        local_40.m_at = DT_REQUIRE;
        local_30 = pf->_line;
        doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                  (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
        doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_e0.m_decomp);
        local_b8.super_AssertData._40_2_ =
             CONCAT11(local_b8.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
        dVar9 = extraout_XMM0_Qa_11;
        if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_e0.m_decomp.field_0.data.ptr);
          dVar9 = extraout_XMM0_Qa_12;
        }
        doctest::detail::ResultBuilder::log(&local_b8,dVar9);
        if (extraout_AL_05 != '\0') {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
        if ((local_b8.super_AssertData.m_failed == true) &&
           (bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at), bVar6)) {
          doctest::detail::throwException();
        }
        if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                             local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                             local_b8.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                             local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                             local_b8.super_AssertData.m_exception.field_0.buf[0]));
        }
        pvVar4 = (this->_pipes).
                 super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                 .
                 super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_false>
                 ._M_head_impl._callable.source;
        psVar2 = (this->_pipes).
                 super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:571:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:581:61)>_>
                 .
                 super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:558:68)>,_false>
                 ._M_head_impl._callable.j1;
        sVar1 = *psVar2;
        *psVar2 = sVar1 + 1;
        iVar7 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar1] + 1;
      }
    }
    local_b8.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(local_b8.super_AssertData.m_test_case._4_4_,iVar7);
    std::variant<int,std::monostate>::operator=
              ((variant<int,std::monostate> *)
               ((this->_buffer).
                super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + pf->_line),(int *)&local_b8);
  }
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}